

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

double trng::math::detail::GammaP_ser<double,false>(double a,double x)

{
  int in_EDI;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar1;
  double in_XMM1_Qa;
  int i;
  double sum;
  double n;
  double xx;
  double eps;
  int itmax;
  bool local_45;
  int local_44;
  double local_40;
  double local_38;
  double local_30;
  double local_8;
  
  Catch::clara::std::numeric_limits<double>::epsilon();
  if (8.881784197001252e-16 <= in_XMM1_Qa) {
    local_40 = 1.0 / in_XMM0_Qa;
    local_44 = 0;
    local_38 = in_XMM0_Qa;
    local_30 = local_40;
    do {
      local_38 = local_38 + 1.0;
      local_44 = local_44 + 1;
      local_30 = (in_XMM1_Qa / local_38) * local_30;
      local_40 = local_30 + local_40;
      Catch::clara::std::abs(in_EDI);
      Catch::clara::std::abs(in_EDI);
      local_45 = extraout_XMM0_Qa_00 * 8.881784197001252e-16 < extraout_XMM0_Qa && local_44 < 0x35;
    } while (local_45);
    dVar1 = ln(1.99303512391e-317);
    local_8 = exp(in_XMM0_Qa * dVar1 + -in_XMM1_Qa);
    local_8 = local_8 * local_40;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

TRNG_CUDA_ENABLE T GammaP_ser(T a, T x) {
        const int itmax{numeric_limits<T>::digits};
        const T eps{4 * numeric_limits<T>::epsilon()};
        if (x < eps)
          return T{0};
        T xx{1 / a}, n{a}, sum{xx};
        int i{0};
        do {
          ++n;
          ++i;
          xx *= x / n;
          sum += xx;
        } while (abs(xx) > eps * abs(sum) and i < itmax);
#if __cplusplus >= 201703L
        if constexpr (by_Gamma_a)
#else
        if (by_Gamma_a)
#endif
          return exp(-x + a * ln(x) - ln_Gamma(a)) * sum;
        else
          return exp(-x + a * ln(x)) * sum;
      }